

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int parse_port_string(vec *vec,socket *so,int *ip_version)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  uint32_t uVar4;
  char *pcVar5;
  ulong uVar6;
  size_t hostnlen;
  char hostname [256];
  char buf [100];
  char *endptr;
  char *cb;
  int len;
  int ch;
  unsigned_long portUL;
  uint local_38;
  uint port;
  uint d;
  uint c;
  uint b;
  uint a;
  int *ip_version_local;
  socket *so_local;
  vec *vec_local;
  
  _b = ip_version;
  ip_version_local = &so->sock;
  so_local = (socket *)vec;
  memset(hostname + 0xf8,0,100);
  memset(ip_version_local,0,0x40);
  *(undefined2 *)(ip_version_local + 1) = 2;
  *_b = 0;
  portUL._4_4_ = 0;
  cb._0_4_ = 0;
  iVar3 = __isoc99_sscanf(*(undefined8 *)so_local,"%u.%u.%u.%u:%u%n",&c,&d,&port,&local_38,
                          (long)&portUL + 4,&cb);
  if (iVar3 == 5) {
    uVar4 = htonl(c << 0x18 | d << 0x10 | port << 8 | local_38);
    ip_version_local[2] = uVar4;
    uVar2 = htons((uint16_t)portUL._4_4_);
    *(uint16_t *)((long)ip_version_local + 6) = uVar2;
    *_b = 4;
  }
  else {
    iVar3 = __isoc99_sscanf(*(undefined8 *)so_local,"[%49[^]]]:%u%n",hostname + 0xf8,
                            (long)&portUL + 4);
    if (((iVar3 == 2) && ((ulong)(long)(int)cb <= *(ulong *)((long)&so_local->lsa + 4))) &&
       (iVar3 = mg_inet_pton(10,hostname + 0xf8,ip_version_local + 1,0x1c,0), iVar3 != 0)) {
      uVar2 = htons((uint16_t)portUL._4_4_);
      *(uint16_t *)((long)ip_version_local + 6) = uVar2;
      *_b = 6;
    }
    else if ((**(char **)so_local == '+') &&
            (iVar3 = __isoc99_sscanf(*(long *)so_local + 1,"%u%n",(long)&portUL + 4,&cb), iVar3 == 1
            )) {
      cb._0_4_ = (int)cb + 1;
      *(undefined2 *)(ip_version_local + 1) = 10;
      uVar2 = htons((uint16_t)portUL._4_4_);
      *(uint16_t *)((long)ip_version_local + 6) = uVar2;
      *_b = 10;
    }
    else {
      _len = strtoul(*(char **)so_local,(char **)(buf + 0x60),0);
      iVar3 = is_valid_port(_len);
      if ((iVar3 == 0) || (*(long *)so_local == stack0xffffffffffffffa0)) {
        pcVar5 = strchr(*(char **)so_local,0x3a);
        if (pcVar5 == (char *)0x0) {
          cb._0_4_ = 0;
        }
        else {
          uVar6 = (long)pcVar5 - *(long *)so_local;
          if ((*(ulong *)((long)&so_local->lsa + 4) <= uVar6) || (0xff < uVar6)) {
            *_b = 0;
            return 0;
          }
          mg_strlcpy((char *)&hostnlen,*(char **)so_local,uVar6 + 1);
          iVar3 = mg_inet_pton(2,(char *)&hostnlen,ip_version_local + 1,0x10,1);
          if (iVar3 == 0) {
            iVar3 = mg_inet_pton(10,(char *)&hostnlen,ip_version_local + 1,0x1c,1);
            if (iVar3 == 0) {
              cb._0_4_ = 0;
            }
            else {
              iVar3 = __isoc99_sscanf(pcVar5 + 1,"%u%n",(long)&portUL + 4,&cb);
              if (iVar3 == 1) {
                *_b = 6;
                uVar2 = htons((uint16_t)portUL._4_4_);
                *(uint16_t *)((long)ip_version_local + 6) = uVar2;
                cb._0_4_ = (int)uVar6 + 1 + (int)cb;
              }
              else {
                cb._0_4_ = 0;
              }
            }
          }
          else {
            iVar3 = __isoc99_sscanf(pcVar5 + 1,"%u%n",(long)&portUL + 4,&cb);
            if (iVar3 == 1) {
              *_b = 4;
              uVar2 = htons((uint16_t)portUL._4_4_);
              *(uint16_t *)((long)ip_version_local + 6) = uVar2;
              cb._0_4_ = (int)uVar6 + 1 + (int)cb;
            }
            else {
              cb._0_4_ = 0;
            }
          }
        }
      }
      else {
        cb._0_4_ = (int)stack0xffffffffffffffa0 - (int)*(undefined8 *)so_local;
        portUL._4_4_ = (uint)_len & 0xffff;
        uVar2 = htons((uint16_t)_len);
        *(uint16_t *)((long)ip_version_local + 6) = uVar2;
        *_b = 4;
      }
    }
  }
  if (((0 < (int)cb) && (iVar3 = is_valid_port((ulong)portUL._4_4_), iVar3 != 0)) &&
     (((long)(int)cb == *(long *)((long)&so_local->lsa + 4) ||
      ((long)(int)cb + 1 == *(long *)((long)&so_local->lsa + 4))))) {
    if ((ulong)(long)(int)cb < *(ulong *)((long)&so_local->lsa + 4)) {
      cVar1 = *(char *)(*(long *)so_local + (long)(int)cb);
    }
    else {
      cVar1 = '\0';
    }
    *(bool *)(ip_version_local + 0xf) = cVar1 == 's';
    *(bool *)((long)ip_version_local + 0x3d) = cVar1 == 'r';
    if (((cVar1 == '\0') || (cVar1 == 's')) || (cVar1 == 'r')) {
      return 1;
    }
  }
  *_b = 0;
  return 0;
}

Assistant:

static int
parse_port_string(const struct vec *vec, struct socket *so, int *ip_version)
{
	unsigned int a, b, c, d;
	unsigned port;
	unsigned long portUL;
	int ch, len;
	const char *cb;
	char *endptr;
#if defined(USE_IPV6)
	char buf[100] = {0};
#endif

	/* MacOS needs that. If we do not zero it, subsequent bind() will fail.
	 * Also, all-zeroes in the socket address means binding to all addresses
	 * for both IPv4 and IPv6 (INADDR_ANY and IN6ADDR_ANY_INIT). */
	memset(so, 0, sizeof(*so));
	so->lsa.sin.sin_family = AF_INET;
	*ip_version = 0;

	/* Initialize len as invalid. */
	port = 0;
	len = 0;

	/* Test for different ways to format this string */
	if (sscanf(vec->ptr,
	           "%u.%u.%u.%u:%u%n",
	           &a,
	           &b,
	           &c,
	           &d,
	           &port,
	           &len) // NOLINT(cert-err34-c) 'sscanf' used to convert a string
	                 // to an integer value, but function will not report
	                 // conversion errors; consider using 'strtol' instead
	    == 5) {
		/* Bind to a specific IPv4 address, e.g. 192.168.1.5:8080 */
		so->lsa.sin.sin_addr.s_addr =
		    htonl((a << 24) | (b << 16) | (c << 8) | d);
		so->lsa.sin.sin_port = htons((uint16_t)port);
		*ip_version = 4;

#if defined(USE_IPV6)
	} else if (sscanf(vec->ptr, "[%49[^]]]:%u%n", buf, &port, &len) == 2
	           && ((size_t)len <= vec->len)
	           && mg_inet_pton(
	                  AF_INET6, buf, &so->lsa.sin6, sizeof(so->lsa.sin6), 0)) {
		/* IPv6 address, examples: see above */
		/* so->lsa.sin6.sin6_family = AF_INET6; already set by mg_inet_pton
		 */
		so->lsa.sin6.sin6_port = htons((uint16_t)port);
		*ip_version = 6;
#endif

	} else if ((vec->ptr[0] == '+')
	           && (sscanf(vec->ptr + 1, "%u%n", &port, &len)
	               == 1)) { // NOLINT(cert-err34-c) 'sscanf' used to convert a
		                    // string to an integer value, but function will not
		                    // report conversion errors; consider using 'strtol'
		                    // instead

		/* Port is specified with a +, bind to IPv6 and IPv4, INADDR_ANY */
		/* Add 1 to len for the + character we skipped before */
		len++;

#if defined(USE_IPV6)
		/* Set socket family to IPv6, do not use IPV6_V6ONLY */
		so->lsa.sin6.sin6_family = AF_INET6;
		so->lsa.sin6.sin6_port = htons((uint16_t)port);
		*ip_version = 4 + 6;
#else
		/* Bind to IPv4 only, since IPv6 is not built in. */
		so->lsa.sin.sin_port = htons((uint16_t)port);
		*ip_version = 4;
#endif

	} else if (is_valid_port(portUL = strtoul(vec->ptr, &endptr, 0))
	           && (vec->ptr != endptr)) {
		len = (int)(endptr - vec->ptr);
		port = (uint16_t)portUL;
		/* If only port is specified, bind to IPv4, INADDR_ANY */
		so->lsa.sin.sin_port = htons((uint16_t)port);
		*ip_version = 4;

	} else if ((cb = strchr(vec->ptr, ':')) != NULL) {
		/* String could be a hostname. This check algorithm
		 * will only work for RFC 952 compliant hostnames,
		 * starting with a letter, containing only letters,
		 * digits and hyphen ('-'). Newer specs may allow
		 * more, but this is not guaranteed here, since it
		 * may interfere with rules for port option lists. */

		/* According to RFC 1035, hostnames are restricted to 255 characters
		 * in total (63 between two dots). */
		char hostname[256];
		size_t hostnlen = (size_t)(cb - vec->ptr);

		if ((hostnlen >= vec->len) || (hostnlen >= sizeof(hostname))) {
			/* This would be invalid in any case */
			*ip_version = 0;
			return 0;
		}

		mg_strlcpy(hostname, vec->ptr, hostnlen + 1);

		if (mg_inet_pton(
		        AF_INET, hostname, &so->lsa.sin, sizeof(so->lsa.sin), 1)) {
			if (sscanf(cb + 1, "%u%n", &port, &len)
			    == 1) { // NOLINT(cert-err34-c) 'sscanf' used to convert a
				        // string to an integer value, but function will not
				        // report conversion errors; consider using 'strtol'
				        // instead
				*ip_version = 4;
				so->lsa.sin.sin_port = htons((uint16_t)port);
				len += (int)(hostnlen + 1);
			} else {
				len = 0;
			}
#if defined(USE_IPV6)
		} else if (mg_inet_pton(AF_INET6,
		                        hostname,
		                        &so->lsa.sin6,
		                        sizeof(so->lsa.sin6),
		                        1)) {
			if (sscanf(cb + 1, "%u%n", &port, &len) == 1) {
				*ip_version = 6;
				so->lsa.sin6.sin6_port = htons((uint16_t)port);
				len += (int)(hostnlen + 1);
			} else {
				len = 0;
			}
#endif
		} else {
			len = 0;
		}

#if defined(USE_X_DOM_SOCKET)

	} else if (vec->ptr[0] == 'x') {
		/* unix (linux) domain socket */
		if (vec->len < sizeof(so->lsa.sun.sun_path)) {
			len = vec->len;
			so->lsa.sun.sun_family = AF_UNIX;
			memset(so->lsa.sun.sun_path, 0, sizeof(so->lsa.sun.sun_path));
			memcpy(so->lsa.sun.sun_path, (char *)vec->ptr + 1, vec->len - 1);
			port = 0;
			*ip_version = 99;
		} else {
			/* String too long */
			len = 0;
		}
#endif

	} else {
		/* Parsing failure. */
		len = 0;
	}

	/* sscanf and the option splitting code ensure the following condition
	 * Make sure the port is valid and vector ends with the port, 's' or 'r' */
	if ((len > 0) && is_valid_port(port)
	    && (((size_t)len == vec->len) || (((size_t)len + 1) == vec->len))) {
		/* Next character after the port number */
		ch = ((size_t)len < vec->len) ? vec->ptr[len] : '\0';
		so->is_ssl = (ch == 's');
		so->ssl_redir = (ch == 'r');
		if ((ch == '\0') || (ch == 's') || (ch == 'r')) {
			return 1;
		}
	}

	/* Reset ip_version to 0 if there is an error */
	*ip_version = 0;
	return 0;
}